

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

parasail_profile_t * parasail_profile_new(char *s1,int s1Len,parasail_matrix_t *matrix)

{
  size_t _size;
  parasail_profile_t *profile;
  parasail_matrix_t *matrix_local;
  int s1Len_local;
  char *s1_local;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_profile_new","matrix");
    s1_local = (char *)0x0;
  }
  else if ((matrix->type == 0) && (s1 == (char *)0x0)) {
    fprintf(_stderr,"%s: missing %s\n","parasail_profile_new","s1");
    s1_local = (char *)0x0;
  }
  else {
    s1_local = (char *)malloc(0x88);
    if (s1_local == (char *)0x0) {
      fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_profile_new",0x88);
      s1_local = (char *)0x0;
    }
    else {
      *(char **)s1_local = s1;
      *(int *)(s1_local + 8) = s1Len;
      *(parasail_matrix_t **)(s1_local + 0x10) = matrix;
      s1_local[0x18] = '\0';
      s1_local[0x19] = '\0';
      s1_local[0x1a] = '\0';
      s1_local[0x1b] = '\0';
      s1_local[0x1c] = '\0';
      s1_local[0x1d] = '\0';
      s1_local[0x1e] = '\0';
      s1_local[0x1f] = '\0';
      s1_local[0x20] = '\0';
      s1_local[0x21] = '\0';
      s1_local[0x22] = '\0';
      s1_local[0x23] = '\0';
      s1_local[0x24] = '\0';
      s1_local[0x25] = '\0';
      s1_local[0x26] = '\0';
      s1_local[0x27] = '\0';
      s1_local[0x28] = '\0';
      s1_local[0x29] = '\0';
      s1_local[0x2a] = '\0';
      s1_local[0x2b] = '\0';
      s1_local[0x2c] = '\0';
      s1_local[0x2d] = '\0';
      s1_local[0x2e] = '\0';
      s1_local[0x2f] = '\0';
      s1_local[0x30] = '\0';
      s1_local[0x31] = '\0';
      s1_local[0x32] = '\0';
      s1_local[0x33] = '\0';
      s1_local[0x34] = '\0';
      s1_local[0x35] = '\0';
      s1_local[0x36] = '\0';
      s1_local[0x37] = '\0';
      s1_local[0x38] = '\0';
      s1_local[0x39] = '\0';
      s1_local[0x3a] = '\0';
      s1_local[0x3b] = '\0';
      s1_local[0x3c] = '\0';
      s1_local[0x3d] = '\0';
      s1_local[0x3e] = '\0';
      s1_local[0x3f] = '\0';
      s1_local[0x40] = '\0';
      s1_local[0x41] = '\0';
      s1_local[0x42] = '\0';
      s1_local[0x43] = '\0';
      s1_local[0x44] = '\0';
      s1_local[0x45] = '\0';
      s1_local[0x46] = '\0';
      s1_local[0x47] = '\0';
      s1_local[0x48] = '\0';
      s1_local[0x49] = '\0';
      s1_local[0x4a] = '\0';
      s1_local[0x4b] = '\0';
      s1_local[0x4c] = '\0';
      s1_local[0x4d] = '\0';
      s1_local[0x4e] = '\0';
      s1_local[0x4f] = '\0';
      s1_local[0x50] = '\0';
      s1_local[0x51] = '\0';
      s1_local[0x52] = '\0';
      s1_local[0x53] = '\0';
      s1_local[0x54] = '\0';
      s1_local[0x55] = '\0';
      s1_local[0x56] = '\0';
      s1_local[0x57] = '\0';
      s1_local[0x58] = '\0';
      s1_local[0x59] = '\0';
      s1_local[0x5a] = '\0';
      s1_local[0x5b] = '\0';
      s1_local[0x5c] = '\0';
      s1_local[0x5d] = '\0';
      s1_local[0x5e] = '\0';
      s1_local[0x5f] = '\0';
      s1_local[0x60] = '\0';
      s1_local[0x61] = '\0';
      s1_local[0x62] = '\0';
      s1_local[99] = '\0';
      s1_local[100] = '\0';
      s1_local[0x65] = '\0';
      s1_local[0x66] = '\0';
      s1_local[0x67] = '\0';
      s1_local[0x68] = '\0';
      s1_local[0x69] = '\0';
      s1_local[0x6a] = '\0';
      s1_local[0x6b] = '\0';
      s1_local[0x6c] = '\0';
      s1_local[0x6d] = '\0';
      s1_local[0x6e] = '\0';
      s1_local[0x6f] = '\0';
      s1_local[0x70] = '\0';
      s1_local[0x71] = '\0';
      s1_local[0x72] = '\0';
      s1_local[0x73] = '\0';
      s1_local[0x74] = '\0';
      s1_local[0x75] = '\0';
      s1_local[0x76] = '\0';
      s1_local[0x77] = '\0';
      s1_local[0x78] = '\0';
      s1_local[0x79] = '\0';
      s1_local[0x7a] = '\0';
      s1_local[0x7b] = '\0';
      s1_local[0x7c] = '\0';
      s1_local[0x7d] = '\0';
      s1_local[0x7e] = '\0';
      s1_local[0x7f] = '\0';
      s1_local[0x80] = -1;
      s1_local[0x81] = -1;
      s1_local[0x82] = -1;
      s1_local[0x83] = '\x7f';
      if (matrix->type == 1) {
        *(int *)(s1_local + 8) = matrix->length;
      }
    }
  }
  return (parasail_profile_t *)s1_local;
}

Assistant:

parasail_profile_t* parasail_profile_new(
        const char * s1, const int s1Len, const parasail_matrix_t *matrix)
{
    /* declare all variables */
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(s1);
    }

    PARASAIL_NEW(profile, parasail_profile_t);

    profile->s1 = s1;
    profile->s1Len = s1Len;
    profile->matrix = matrix;
    profile->profile8.score = NULL;
    profile->profile8.matches = NULL;
    profile->profile8.similar = NULL;
    profile->profile16.score = NULL;
    profile->profile16.matches = NULL;
    profile->profile16.similar = NULL;
    profile->profile32.score = NULL;
    profile->profile32.matches = NULL;
    profile->profile32.similar = NULL;
    profile->profile64.score = NULL;
    profile->profile64.matches = NULL;
    profile->profile64.similar = NULL;
    profile->free = NULL;
    profile->stop = INT32_MAX;

    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        profile->s1Len = matrix->length;
    }

    return profile;
}